

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void slang::uintToStrImpl<unsigned_long>
               (SmallVectorBase<char> *buffer,char *format,unsigned_long value)

{
  ulong uVar1;
  int iVar2;
  ValueInitTag local_29;
  
  iVar2 = snprintf((char *)0x0,0,format,value);
  uVar1 = buffer->len;
  SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::ValueInitTag>
            (buffer,(long)iVar2 + uVar1 + 1,&local_29);
  if (buffer->len <= uVar1) {
    assert::assertFailed
              ("index < len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x196,"reference slang::SmallVectorBase<char>::operator[](size_type) [T = char]");
  }
  snprintf(buffer->data_ + uVar1,(long)iVar2 + 1,format,value);
  if (buffer->len != 0) {
    buffer->len = buffer->len - 1;
    return;
  }
  assert::assertFailed
            ("len",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
             ,0x97,"void slang::SmallVectorBase<char>::pop_back() [T = char]");
}

Assistant:

void uintToStrImpl(SmallVectorBase<char>& buffer, const char* format, T value) {
    size_t sz = (size_t)snprintf(nullptr, 0, format, value);
    size_t offset = buffer.size();
    buffer.resize(buffer.size() + sz + 1);

    snprintf(&buffer[offset], sz + 1, format, value);
    buffer.pop_back();
}